

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshFace::IsValid(ON_MeshFace *this,uint mesh_vertex_count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint *uvi;
  
  uVar1 = this->vi[0];
  if (((uVar1 < mesh_vertex_count) && (uVar2 = this->vi[1], uVar2 < mesh_vertex_count)) &&
     (uVar3 = this->vi[2], uVar3 < mesh_vertex_count)) {
    bVar5 = false;
    bVar6 = false;
    if (((uVar3 != uVar1) && (bVar6 = bVar5, uVar2 != uVar3)) &&
       ((uVar1 != uVar2 &&
        ((uVar4 = this->vi[3], uVar4 < mesh_vertex_count && (bVar6 = true, uVar3 != uVar4)))))) {
      bVar6 = uVar2 != uVar4 && uVar1 != uVar4;
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool
ON_MeshFace::IsValid(unsigned int mesh_vertex_count) const
{
  const unsigned int* uvi = (const unsigned int*)vi;
  return (uvi[0] < mesh_vertex_count
    && uvi[1] < mesh_vertex_count
    && uvi[2] < mesh_vertex_count
    && uvi[3] < mesh_vertex_count
    && uvi[0] != uvi[1] && uvi[1] != uvi[2] && uvi[2] != uvi[0]
    && (uvi[2] == uvi[3] || (uvi[0] != uvi[3] && uvi[1] != uvi[3])));
}